

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<float>>,Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>>,std::complex<float>,std::complex<float>>
               (Matrix<std::complex<float>,__1,_1,_0,__1,_1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<float>_>,_Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>
               *src,assign_op<std::complex<float>,_std::complex<float>_> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<std::complex<float>,_std::complex<float>_> *param_2_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<float>_>,_Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>
  *src_local;
  Matrix<std::complex<float>,__1,_1,_0,__1,_1> *dst_local;
  
  IVar1 = CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<float>_>,_Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>
          ::rows(src);
  cols = CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<float>_>,_Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>
         ::cols(src);
  IVar2 = PlainObjectBase<Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>::rows
                    (&dst->
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>::cols
                      (&dst->
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>)
    ;
    if (IVar2 == cols) goto LAB_0012f1cd;
  }
  PlainObjectBase<Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>,IVar1
             ,cols);
LAB_0012f1cd:
  IVar2 = PlainObjectBase<Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>::rows
                    (&dst->
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>::cols
                      (&dst->
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>)
    ;
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<std::complex<float>, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<float>>, Eigen::Matrix<std::complex<float>, -1, 1>>, T1 = std::complex<float>, T2 = std::complex<float>]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}